

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrLevel.cpp
# Opt level: O0

BoxArray * __thiscall amrex::AmrLevel::getNodalBoxArray(AmrLevel *this)

{
  bool bVar1;
  BoxArray *in_RDI;
  BoxArray *this_00;
  
  this_00 = in_RDI;
  bVar1 = BoxArray::empty((BoxArray *)0x10f945f);
  if (bVar1) {
    BoxArray::operator=(in_RDI,(BoxArray *)&in_RDI[8].m_bat.m_op.m_bndryReg.m_loshft);
    BoxArray::surroundingNodes(this_00);
  }
  return (BoxArray *)((long)&in_RDI[8].m_bat.m_op + 0x14);
}

Assistant:

const BoxArray&
AmrLevel::getNodalBoxArray () const noexcept
{
    if (nodal_grids.empty()) {
        nodal_grids = grids;
        nodal_grids.surroundingNodes();
    }
    return nodal_grids;
}